

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void slang::ast::PrimitiveInstanceSymbol::fromSyntax
               (PrimitiveSymbol *primitive,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  Scope *this;
  Compilation *this_00;
  char *pcVar1;
  pointer end;
  Compilation *compilation;
  HierarchicalInstanceSyntax *syntax_00;
  SmallVectorBase<int> *path_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes_00;
  NetType *netType;
  PrimitiveSymbol *primitive_00;
  size_t index;
  ulong uVar2;
  Symbol *symbol;
  SmallVector<int,_10UL> path;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  implicitNetNames;
  pointer in_stack_fffffffffffffe50;
  PrimitiveInstanceSymbol *in_stack_fffffffffffffe60;
  AttributeInstanceSyntax *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 local_148 [40];
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  local_120;
  
  local_120.
  super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>
  .ptr = (sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *)
         (local_148 + 0x28);
  local_120.
  super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  .
  super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>
  .storage = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>
              *)local_120.
                super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>
                .ptr;
  local_120.
  super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  .entries = ska::detailv3::empty_default_table<std::basic_string_view<char,std::char_traits<char>>>
                       ();
  local_120.
  super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  .num_slots_minus_one = 0;
  local_120.
  super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  .hash_policy.shift = '?';
  local_120.
  super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  .max_lookups = '\x03';
  local_120.
  super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  ._max_load_factor = 0.5;
  local_120.
  super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
  .
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  .num_elements = 0;
  local_160 = (AttributeInstanceSyntax *)local_148;
  local_158 = 0;
  local_150 = 10;
  this = (context->scope).ptr;
  if (this == (Scope *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
              );
  }
  this_00 = this->compilation;
  netType = Scope::getDefaultNetType(this);
  uVar2 = (syntax->instances).elements.size_ + 1;
  if (1 < uVar2) {
    index = 0;
    do {
      primitive_00 = (PrimitiveSymbol *)
                     slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
                     operator[](&syntax->instances,index);
      local_158 = 0;
      anon_unknown.dwarf_417dc2::createImplicitNets
                ((HierarchicalInstanceSyntax *)primitive_00,context,netType,
                 (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
                  *)(local_148 + 0x28),implicitNets);
      pcVar1 = (primitive_00->super_Symbol).name._M_str;
      if (pcVar1 == (char *)0x0) {
        compilation = (Compilation *)(context->scope).ptr;
        if (compilation == (Compilation *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                    );
        }
        syntax_00 = (HierarchicalInstanceSyntax *)
                    (syntax->super_MemberSyntax).attributes.
                    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                    data_;
        path_00 = (SmallVectorBase<int> *)
                  (syntax->super_MemberSyntax).attributes.
                  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_
        ;
        if (path_00 != (SmallVectorBase<int> *)0x0 && syntax_00 == (HierarchicalInstanceSyntax *)0x0
           ) goto LAB_001bca16;
        attributes.size_ = (size_type)in_stack_fffffffffffffe50;
        attributes.data_ = &local_160;
        in_stack_fffffffffffffe60 =
             anon_unknown_65::createPrimInst
                       ((anon_unknown_65 *)this_00,compilation,(Scope *)primitive,primitive_00,
                        syntax_00,attributes,path_00);
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)results,
                   (Symbol **)&stack0xfffffffffffffe60);
      }
      else {
        end = (syntax->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
        in_stack_fffffffffffffe50 =
             (pointer)(syntax->super_MemberSyntax).attributes.
                      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                      size_;
        if (in_stack_fffffffffffffe50 != (pointer)0x0 && end == (pointer)0x0) {
LAB_001bca16:
          std::terminate();
        }
        attributes_00.size_ = (size_type)&local_160;
        attributes_00.data_ = in_stack_fffffffffffffe50;
        in_stack_fffffffffffffe60 =
             (PrimitiveInstanceSymbol *)
             anon_unknown_65::recursePrimArray
                       ((anon_unknown_65 *)this_00,(Compilation *)primitive,primitive_00,
                        (HierarchicalInstanceSyntax *)context,*(ASTContext **)(pcVar1 + 0x40),
                        (DimIterator)
                        (&(*(ASTContext **)(pcVar1 + 0x40))->scope + *(long *)(pcVar1 + 0x48)),
                        (DimIterator)end,attributes_00,
                        (SmallVectorBase<int> *)in_stack_fffffffffffffe60);
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)results,
                   (Symbol **)&stack0xfffffffffffffe60);
      }
      index = index + 1;
    } while (uVar2 >> 1 != index);
  }
  if (local_160 != (AttributeInstanceSyntax *)local_148) {
    free(local_160);
  }
  ska::detailv3::
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  ::~sherwood_v3_table
            (&local_120.
              super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
            );
  return;
}

Assistant:

void PrimitiveInstanceSymbol::fromSyntax(const PrimitiveSymbol& primitive,
                                         const HierarchyInstantiationSyntax& syntax,
                                         const ASTContext& context,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    createPrimitives(primitive, syntax, context, results, implicitNets);
}